

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void get_op_access(cs_struct *h,uint id,uint8_t *access,uint64_t *eflags)

{
  uint8_t *puVar1;
  undefined1 *in_RDX;
  uint8_t *arr;
  uint8_t i;
  uint64_t *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte bVar2;
  
  puVar1 = X86_get_op_access((cs_struct *)
                             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                             (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                             in_stack_ffffffffffffffc8);
  if (puVar1 == (uint8_t *)0x0) {
    *in_RDX = 0;
  }
  else {
    for (bVar2 = 0; puVar1[bVar2] != '\0'; bVar2 = bVar2 + 1) {
      if (puVar1[bVar2] == 0x80) {
        in_RDX[bVar2] = 0;
      }
      else {
        in_RDX[bVar2] = puVar1[bVar2];
      }
    }
    in_RDX[bVar2] = 0;
  }
  return;
}

Assistant:

static void get_op_access(cs_struct *h, unsigned int id, uint8_t *access, uint64_t *eflags)
{
#ifndef CAPSTONE_DIET
	uint8_t i;
	uint8_t *arr = X86_get_op_access(h, id, eflags);

	if (!arr) {
		access[0] = 0;
		return;
	}

	// copy to access but zero out CS_AC_IGNORE
	for(i = 0; arr[i]; i++) {
		if (arr[i] != CS_AC_IGNORE)
			access[i] = arr[i];
		else
			access[i] = 0;
	}

	// mark the end of array
	access[i] = 0;
#endif
}